

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

loc find_normal_to_wall(chunk_conflict *c,loc grid,_Bool inner)

{
  _Bool _Var1;
  uint32_t uVar2;
  loc_conflict grid_00;
  loc chk;
  loc choices [8];
  int local_30;
  wchar_t local_2c;
  wchar_t i;
  wchar_t ncardinal;
  wchar_t n;
  _Bool inner_local;
  chunk_conflict *c_local;
  loc grid_local;
  
  i = L'\0';
  local_2c = L'\0';
  _Var1 = square_is_granite_with_flag(c,grid,L'\f');
  if ((!_Var1) && (_Var1 = square_is_granite_with_flag(c,grid,L'\r'), !_Var1)) {
    __assert_fail("square_is_granite_with_flag(c, grid, SQUARE_WALL_OUTER) || square_is_granite_with_flag(c, grid, SQUARE_WALL_SOLID)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/timschumi[P]angband/src/gen-cave.c"
                  ,0x19c,"struct loc find_normal_to_wall(struct chunk *, struct loc, _Bool)");
  }
  for (local_30 = 0; local_30 < 8; local_30 = local_30 + 1) {
    grid_00 = (loc_conflict)loc_sum(grid,ddgrid_ddd[local_30]);
    _Var1 = square_in_bounds((chunk *)c,grid_00);
    if (((((_Var1) && (_Var1 = square_isperm((chunk *)c,grid_00), !_Var1)) &&
         (_Var1 = square_isroom((chunk *)c,grid_00), _Var1 == inner)) &&
        ((_Var1 = square_is_granite_with_flag(c,(loc)grid_00,L'\f'), !_Var1 &&
         (_Var1 = square_is_granite_with_flag(c,(loc)grid_00,L'\r'), !_Var1)))) &&
       (_Var1 = square_is_granite_with_flag(c,(loc)grid_00,L'\v'), !_Var1)) {
      choices[(long)i + -1] = ddgrid_ddd[local_30];
      i = i + L'\x01';
      if (local_30 < 4) {
        local_2c = local_2c + L'\x01';
      }
    }
  }
  if ((L'\x01' < i) && (L'\0' < local_2c)) {
    i = local_2c;
  }
  if (i == L'\0') {
    grid_local = loc(0,0);
  }
  else {
    uVar2 = Rand_div(i);
    grid_local = choices[(long)(int)uVar2 + -1];
  }
  return grid_local;
}

Assistant:

static struct loc find_normal_to_wall(struct chunk *c, struct loc grid,
	bool inner)
{
	int n = 0, ncardinal = 0, i;
	struct loc choices[8];

	assert(square_is_granite_with_flag(c, grid, SQUARE_WALL_OUTER) ||
		square_is_granite_with_flag(c, grid, SQUARE_WALL_SOLID));
	/* Relies on the cardinal directions being first in ddgrid_ddd. */
	for (i = 0; i < 8; ++i) {
		struct loc chk = loc_sum(grid, ddgrid_ddd[i]);

		if (square_in_bounds(c, chk) &&
			!square_isperm(c, chk) &&
			(square_isroom(c, chk) == inner) &&
			!square_is_granite_with_flag(c, chk, SQUARE_WALL_OUTER) &&
			!square_is_granite_with_flag(c, chk, SQUARE_WALL_SOLID) &&
			!square_is_granite_with_flag(c, chk, SQUARE_WALL_INNER)) {
			choices[n] = ddgrid_ddd[i];
			++n;
			if (i < 4) {
				++ncardinal;
			}
		}
	}
	/* Prefer a cardinal direction if available. */
	if (n > 1 && ncardinal > 0) {
		n = ncardinal;
	}
	return (n == 0) ? loc(0, 0) : choices[randint0(n)];
}